

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O3

void http1_sse_on_close(intptr_t uuid,fio_protocol_s *p_)

{
  code *pcVar1;
  _func_void_intptr_t_fio_protocol_s_ptr *ptr;
  long *__ptr;
  long *plVar2;
  long lVar3;
  subscription_s *s;
  
  ptr = p_[1].on_data;
  while (*(code **)(ptr + 0x48) != ptr + 0x40) {
    __ptr = *(long **)(ptr + 0x40);
    if ((__ptr == (long *)0x0) || (plVar2 = (long *)__ptr[1], plVar2 == __ptr)) {
      s = (subscription_s *)0x0;
    }
    else {
      lVar3 = *__ptr;
      s = (subscription_s *)__ptr[2];
      *plVar2 = lVar3;
      *(long **)(lVar3 + 8) = plVar2;
      free(__ptr);
    }
    fio_unsubscribe(s);
  }
  if (*(code **)(ptr + 0x18) != (code *)0x0) {
    (**(code **)(ptr + 0x18))(ptr);
  }
  *(undefined8 *)(ptr + 0x28) = 0xffffffffffffffff;
  LOCK();
  pcVar1 = ptr + 0x60;
  *(long *)pcVar1 = *(long *)pcVar1 + -1;
  UNLOCK();
  if (*(long *)pcVar1 == 0) {
    fio_free(ptr);
  }
  fio_free(p_);
  return;
}

Assistant:

static void http1_sse_on_close(intptr_t uuid, fio_protocol_s *p_) {
  http1_sse_fio_protocol_s *p = (http1_sse_fio_protocol_s *)p_;
  http_sse_destroy(p->sse);
  fio_free(p);
  (void)uuid;
}